

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanMemoryManager::ShrinkMemory(VulkanMemoryManager *this)

{
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  reference pvVar4;
  pointer ppVar5;
  VulkanMemoryPage *this_00;
  void *pvVar6;
  VkDeviceSize VVar7;
  undefined8 uVar8;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  in_stack_fffffffffffffee0;
  char (*local_108) [15];
  ulong local_e0;
  MemorySizeFormatter<unsigned_long> local_b8;
  MemorySizeFormatter<unsigned_long> local_a0;
  undefined1 local_88 [8];
  string _msg;
  VkDeviceSize PageSize;
  VkDeviceSize ReserveSize;
  bool IsHostVisible;
  VulkanMemoryPage *Page;
  iterator curr_it;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_28;
  iterator it;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> Lock;
  VulkanMemoryManager *this_local;
  
  Lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m_PagesMtx);
  pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_CurrAllocatedSize,0);
  if ((this->m_DeviceLocalReserveSize < *pvVar4) ||
     (pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_CurrAllocatedSize,1),
     this->m_HostVisibleReserveSize < *pvVar4)) {
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
         ::begin(&this->m_Pages);
    while( true ) {
      curr_it = std::
                unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
                ::end(&this->m_Pages);
      bVar2 = std::__detail::operator!=
                        (&local_28,
                         &curr_it.
                          super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                        );
      if (!bVar2) break;
      Page = (VulkanMemoryPage *)local_28._M_cur;
      std::__detail::
      _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                    *)&local_28);
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                             *)&Page);
      this_00 = &ppVar5->second;
      pvVar6 = VulkanMemoryPage::GetCPUMemory(this_00);
      bVar2 = pvVar6 != (void *)0x0;
      if (bVar2) {
        local_e0 = this->m_HostVisibleReserveSize;
      }
      else {
        local_e0 = this->m_DeviceLocalReserveSize;
      }
      bVar3 = VulkanMemoryPage::IsEmpty(this_00);
      if ((bVar3) &&
         (pvVar4 = std::array<unsigned_long,_2UL>::operator[]
                             (&this->m_CurrAllocatedSize,(long)(int)(uint)bVar2), local_e0 < *pvVar4
         )) {
        VVar7 = VulkanMemoryPage::GetPageSize(this_00);
        _msg.field_2._8_8_ = VVar7;
        pvVar4 = std::array<unsigned_long,_2UL>::operator[]
                           (&this->m_CurrAllocatedSize,(long)(int)(uint)bVar2);
        *pvVar4 = *pvVar4 - VVar7;
        if (bVar2) {
          local_108 = (char (*) [15])0xc359f4;
        }
        else {
          local_108 = (char (*) [15])0xc35a01;
        }
        Diligent::FormatMemorySize<unsigned_long>(&local_a0,_msg.field_2._8_8_,2,0);
        pvVar4 = std::array<unsigned_long,_2UL>::operator[](&this->m_CurrAllocatedSize,(ulong)bVar2)
        ;
        Diligent::FormatMemorySize<unsigned_long>(&local_b8,*pvVar4,2,0);
        Diligent::
        FormatString<char[22],std::__cxx11::string,char[15],char[13],char[8],Diligent::MemorySizeFormatter<unsigned_long>,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
                  ((string *)local_88,(Diligent *)"VulkanMemoryManager \'",
                   (char (*) [22])&this->m_MgrName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\': destroying ",local_108,(char (*) [13])" page (",(char (*) [8])&local_a0,
                   (MemorySizeFormatter<unsigned_long> *)"). Current allocated size: ",
                   (char (*) [28])&local_b8,
                   (MemorySizeFormatter<unsigned_long> *)in_stack_fffffffffffffee0._M_cur);
        puVar1 = Diligent::DebugMessageCallback;
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          uVar8 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(0,uVar8,0);
        }
        std::__cxx11::string::~string((string *)local_88);
        (*this->_vptr_VulkanMemoryManager[1])(this,this_00);
        in_stack_fffffffffffffee0._M_cur =
             (__node_type *)
             std::
             unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
             ::erase(&this->m_Pages,(iterator)Page);
      }
    }
    it.
    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
    ._M_cur._4_4_ = 0;
  }
  else {
    it.
    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
    ._M_cur._4_4_ = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void VulkanMemoryManager::ShrinkMemory()
{
    std::lock_guard<std::mutex> Lock{m_PagesMtx};
    if (m_CurrAllocatedSize[0] <= m_DeviceLocalReserveSize && m_CurrAllocatedSize[1] <= m_HostVisibleReserveSize)
        return;

    auto it = m_Pages.begin();
    while (it != m_Pages.end())
    {
        auto curr_it = it;
        ++it;
        auto& Page          = curr_it->second;
        bool  IsHostVisible = Page.GetCPUMemory() != nullptr;
        auto  ReserveSize   = IsHostVisible ? m_HostVisibleReserveSize : m_DeviceLocalReserveSize;
        if (Page.IsEmpty() && m_CurrAllocatedSize[IsHostVisible ? 1 : 0] > ReserveSize)
        {
            auto PageSize = Page.GetPageSize();
            m_CurrAllocatedSize[IsHostVisible ? 1 : 0] -= PageSize;
            LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': destroying ", (IsHostVisible ? "host-visible" : "device-local"),
                             " page (", Diligent::FormatMemorySize(PageSize, 2),
                             "). Current allocated size: ",
                             Diligent::FormatMemorySize(m_CurrAllocatedSize[IsHostVisible ? 1 : 0], 2));
            OnPageDestroy(Page);
            m_Pages.erase(curr_it);
        }
    }
}